

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O3

int connection_get_idle_timeout(CONNECTION_HANDLE connection,milliseconds *idle_timeout)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if (connection == (CONNECTION_HANDLE)0x0 || idle_timeout == (milliseconds *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x64b;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                ,"connection_get_idle_timeout",0x64a,1,
                "Bad arguments: connection = %p, idle_timeout = %p",connection,idle_timeout);
    }
  }
  else {
    *idle_timeout = connection->idle_timeout;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int connection_get_idle_timeout(CONNECTION_HANDLE connection, milliseconds* idle_timeout)
{
    int result;

    /* Codes_S_R_S_CONNECTION_01_190: [If connection or idle_timeout is NULL, connection_get_idle_timeout shall fail and return a non-zero value.] */
    if ((connection == NULL) ||
        (idle_timeout == NULL))
    {
        LogError("Bad arguments: connection = %p, idle_timeout = %p",
            connection, idle_timeout);
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_S_R_S_CONNECTION_01_188: [connection_get_idle_timeout shall return in the idle_timeout argument the current idle_timeout setting.] */
        *idle_timeout = connection->idle_timeout;

        /* Codes_S_R_S_CONNECTION_01_189: [On success, connection_get_idle_timeout shall return 0.] */
        result = 0;
    }

    return result;
}